

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O2

value * __thiscall
mjs::function_object::call
          (value *__return_storage_ptr__,function_object *this,value *this_,
          vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_function *pgVar1;
  not_callable_exception *this_00;
  gc_heap_ptr_untyped local_70;
  gc_heap_ptr_untyped local_60;
  value local_50;
  
  if ((this->call_).pos_ != 0) {
    pgVar1 = gc_heap_ptr_untracked<mjs::gc_function,_true>::dereference
                       (&this->call_,(this->super_native_object).super_object.heap_);
    (**(code **)((long)pgVar1[1] + 8))(__return_storage_ptr__,pgVar1 + 1,this_,args);
    return __return_storage_ptr__;
  }
  this_00 = (not_callable_exception *)__cxa_allocate_exception(0x10);
  gc_heap::unsafe_track<mjs::function_object>
            ((gc_heap *)&local_70,(function_object *)(this->super_native_object).super_object.heap_)
  ;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_60,&local_70);
  value::value(&local_50,(object_ptr *)&local_60);
  not_callable_exception::not_callable_exception(this_00,&local_50);
  __cxa_throw(this_00,&not_callable_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

value function_object::call(const value& this_, const std::vector<value>& args) const {
    if (!call_) throw not_callable_exception{value{heap().unsafe_track(*this)}};
    return call_.dereference(heap()).call(this_, args);
}